

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlXPathNodeTrailingSorted(void)

{
  int iVar1;
  int iVar2;
  xmlNodeSetPtr val;
  xmlNodePtr val_00;
  xmlNodeSetPtr val_01;
  int local_34;
  int n_node;
  xmlNodePtr node;
  int n_nodes;
  xmlNodeSetPtr nodes;
  xmlNodeSetPtr ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (node._4_4_ = 0; (int)node._4_4_ < 1; node._4_4_ = node._4_4_ + 1) {
    for (local_34 = 0; local_34 < 3; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlNodeSetPtr(node._4_4_,0);
      val_00 = gen_xmlNodePtr(local_34,1);
      val_01 = (xmlNodeSetPtr)xmlXPathNodeTrailingSorted(val,val_00);
      desret_xmlNodeSetPtr(val_01);
      call_tests = call_tests + 1;
      des_xmlNodeSetPtr(node._4_4_,val,0);
      des_xmlNodePtr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlXPathNodeTrailingSorted",(ulong)(uint)(iVar2 - iVar1))
        ;
        ret_val._4_4_ = ret_val._4_4_ + 1;
        printf(" %d",(ulong)node._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlXPathNodeTrailingSorted(void) {
    int test_ret = 0;

#if defined(LIBXML_XPATH_ENABLED)
    int mem_base;
    xmlNodeSetPtr ret_val;
    xmlNodeSetPtr nodes; /* a node-set, sorted by document order */
    int n_nodes;
    xmlNodePtr node; /* a node */
    int n_node;

    for (n_nodes = 0;n_nodes < gen_nb_xmlNodeSetPtr;n_nodes++) {
    for (n_node = 0;n_node < gen_nb_xmlNodePtr;n_node++) {
        mem_base = xmlMemBlocks();
        nodes = gen_xmlNodeSetPtr(n_nodes, 0);
        node = gen_xmlNodePtr(n_node, 1);

        ret_val = xmlXPathNodeTrailingSorted(nodes, node);
        desret_xmlNodeSetPtr(ret_val);
        call_tests++;
        des_xmlNodeSetPtr(n_nodes, nodes, 0);
        des_xmlNodePtr(n_node, node, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlXPathNodeTrailingSorted",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_nodes);
            printf(" %d", n_node);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}